

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_class.hpp
# Opt level: O3

void __thiscall libtorrent::peer_class_pool::~peer_class_pool(peer_class_pool *this)

{
  pointer psVar1;
  
  psVar1 = (this->m_free_list).
           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->m_free_list).
                                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  ::std::deque<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_>::~deque
            ((deque<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_> *)this);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT peer_class_pool
	{
		peer_class_t new_peer_class(std::string label);
		void decref(peer_class_t c);
		void incref(peer_class_t c);
		peer_class* at(peer_class_t c);
		peer_class const* at(peer_class_t c) const;

	private:

		// state for peer classes (a peer can belong to multiple classes)
		// this can control
		aux::deque<peer_class, peer_class_t> m_peer_classes;

		// indices in m_peer_classes that are no longer used
		std::vector<peer_class_t> m_free_list;
	}